

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_MOVE_ATTACK(effect_handler_context_t *context)

{
  loc lVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  monster *pmVar5;
  bool bVar6;
  wchar_t d_test;
  int iStack_64;
  _Bool attack;
  wchar_t choice [3];
  monster *mon;
  int iStack_40;
  int iStack_3c;
  _Bool fear;
  loc_conflict grid_diff;
  loc_conflict next_grid;
  loc_conflict target;
  wchar_t i;
  wchar_t d;
  wchar_t moves;
  wchar_t blows;
  effect_handler_context_t *context_local;
  
  wVar3 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  i = L'\x04';
  next_grid.x = (player->grid).x;
  next_grid.y = (player->grid).y;
  if (context->dir == L'\x05') {
    target_get((loc *)&next_grid);
  }
  else {
    choice._4_8_ = loc_sum(player->grid,ddgrid[context->dir]);
    next_grid = (loc_conflict)choice._4_8_;
  }
  pmVar5 = square_monster((chunk *)cave,next_grid);
  if ((pmVar5 == (monster *)0x0) || (_Var2 = monster_is_obvious(pmVar5), !_Var2)) {
    msg("This spell must target a monster.");
    return false;
  }
  do {
    wVar4 = distance(player->grid,(loc)next_grid);
    if (wVar4 < L'\x02' || i < L'\x01') {
      d = (wVar3 * i + 2) / 4;
      do {
        if (d < L'\x01') {
          return true;
        }
        _Var2 = py_attack_real(player,next_grid,(_Bool *)((long)&mon + 7));
        d = d + L'\xffffffff';
      } while (!_Var2);
      return true;
    }
    _iStack_64 = 0x100000000;
    choice[0] = L'\xffffffff';
    bVar6 = false;
    _iStack_40 = loc_diff((loc)next_grid,player->grid);
    lVar1 = _iStack_40;
    if (iStack_40 == 0) {
      target.y = L'\x04';
      if ((long)_iStack_40 < 0) {
        target.y = L'\0';
      }
    }
    else if (iStack_3c == 0) {
      target.y = L'\x02';
      if (iStack_40 < 0) {
        target.y = L'\x06';
      }
    }
    else if (iStack_40 < 0) {
      target.y = L'\x05';
      if ((long)_iStack_40 < 0) {
        target.y = L'\a';
      }
    }
    else {
      target.y = L'\x03';
      if ((long)_iStack_40 < 0) {
        target.y = L'\x01';
      }
    }
    _iStack_40 = lVar1;
    for (target.x = L'\0'; target.x < L'\x03'; target.x = target.x + L'\x01') {
      wVar4 = (target.y + (&iStack_64)[target.x] + 8) % 8;
      grid_diff = (loc_conflict)loc_sum(player->grid,clockwise_grid[wVar4]);
      _Var2 = square_ispassable((chunk *)cave,grid_diff);
      if (_Var2) {
        pmVar5 = square_monster((chunk *)cave,grid_diff);
        bVar6 = pmVar5 != (monster *)0x0;
        target.y = wVar4;
        break;
      }
      if (target.x == L'\x02') {
        msg("The way is barred.");
        return i != L'\x04';
      }
    }
    move_player((int)clockwise_ddd[target.y],false);
    i = i + L'\xffffffff';
    if (bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool effect_handler_MOVE_ATTACK(effect_handler_context_t *context)
{
	int blows = effect_calculate_value(context, false);
	int moves = 4;
	int d, i;
	struct loc target = player->grid;
	struct loc next_grid, grid_diff;
	bool fear;
	struct monster *mon;

	/* Ask for a target */
	if (context->dir == DIR_TARGET) {
		target_get(&target);
	} else {
		target = loc_sum(player->grid, ddgrid[context->dir]);
	}

	mon = square_monster(cave, target);
	if (mon == NULL || !monster_is_obvious(mon)) {
		msg("This spell must target a monster.");
		return false;
	}

	while (distance(player->grid, target) > 1 && moves > 0) {
		int choice[] = { 0, 1, -1 };
		bool attack = false;
		grid_diff = loc_diff(target, player->grid);

		/* Choice of direction simplified by prioritizing diagonals */
		if (grid_diff.x == 0) {
			d = (grid_diff.y < 0) ? 0 : 4; /* up : down */
		} else if (grid_diff.y == 0) {
			d = (grid_diff.x < 0) ? 6 : 2; /* left : right */
		} else if (grid_diff.x < 0) {
			d = (grid_diff.y < 0) ? 7 : 5; /* up-left : down-left */
		} else {/* grid_diff.x > 0 */
			d = (grid_diff.y < 0) ? 1 : 3; /* up-right : down-right */
		}

		/* We'll give up to 3 choices: d, d + 1, d - 1 */
		for (i = 0; i < 3; i++) {
			int d_test = (d + choice[i] + 8) % 8;
			next_grid = loc_sum(player->grid, clockwise_grid[d_test]);
			if (square_ispassable(cave, next_grid)) {
				d = d_test;
				if (square_monster(cave, next_grid)) attack = true;
				break;
			} else if (i == 2) {
				msg("The way is barred.");
				return moves != 4;
			}
		}

		move_player(clockwise_ddd[d], false);
		moves--;
		if (attack) return false;
	}

	/* Reduce blows based on distance traveled, round to nearest blow */
	blows = (blows * moves + 2) / 4;

	/* Should return some energy if monster dies early */
	while (blows-- > 0) {
		if (py_attack_real(player, target, &fear)) break;
	}

	return true;
}